

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_clean_with_criterium(curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  curl_llist *pcVar1;
  curl_llist_element *pcVar2;
  int iVar3;
  curl_hash_element *he;
  int i;
  curl_llist *list;
  curl_llist_element *lnext;
  curl_llist_element *le;
  _func_int_void_ptr_void_ptr *comp_local;
  void *user_local;
  curl_hash *h_local;
  
  if (h != (curl_hash *)0x0) {
    for (he._4_4_ = 0; he._4_4_ < h->slots; he._4_4_ = he._4_4_ + 1) {
      pcVar1 = h->table;
      pcVar2 = pcVar1[he._4_4_].head;
      while (lnext = pcVar2, lnext != (curl_llist_element *)0x0) {
        pcVar2 = lnext->next;
        if ((comp == (_func_int_void_ptr_void_ptr *)0x0) ||
           (iVar3 = (*comp)(user,*(void **)((long)lnext->ptr + 0x18)), iVar3 != 0)) {
          Curl_llist_remove(pcVar1 + he._4_4_,lnext,h);
          h->size = h->size - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  struct curl_llist_element *le;
  struct curl_llist_element *lnext;
  struct curl_llist *list;
  int i;

  if(!h)
    return;

  for(i = 0; i < h->slots; ++i) {
    list = &h->table[i];
    le = list->head; /* get first list entry */
    while(le) {
      struct curl_hash_element *he = le->ptr;
      lnext = le->next;
      /* ask the callback function if we shall remove this entry or not */
      if(comp == NULL || comp(user, he->ptr)) {
        Curl_llist_remove(list, le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}